

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall
asl::HttpServer::serveFile(HttpServer *this,HttpRequest *request,HttpResponse *response)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  undefined8 b;
  String path;
  Date ifdate;
  String localpath;
  File file;
  undefined1 local_140 [24];
  String local_128;
  char local_109;
  String local_108;
  undefined1 local_f0 [24];
  String local_d8;
  String local_c0;
  String local_a8;
  String local_90;
  undefined1 local_78 [32];
  Long local_58;
  
  if ((request->_method)._size == 0) {
    paVar4 = &(request->_method).field_2;
  }
  else {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(request->_method).field_2._str;
  }
  iVar2 = strcmp(paVar4->_space,"GET");
  if (iVar2 != 0) {
    HttpResponse::setCode(response,0x1f5);
    String::String((String *)local_78,"Content-Type");
    String::String(&local_108,"text/plain");
    HttpMessage::setHeader(&response->super_HttpMessage,(String *)local_78,&local_108);
    if (local_108._size != 0) {
      free(local_108.field_2._str);
    }
    if (local_78._0_4_ != 0) {
      free((void *)local_78._8_8_);
    }
    HttpMessage::put(&response->super_HttpMessage,"Not implemented");
    return;
  }
  iVar2 = (request->_path)._len;
  String::alloc(&local_108,iVar2);
  b = &local_108.field_2;
  uVar3 = b;
  if (local_108._size != 0) {
    uVar3 = local_108.field_2._str;
  }
  if ((request->_path)._size == 0) {
    paVar4 = &(request->_path).field_2;
  }
  else {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(request->_path).field_2._str;
  }
  local_108._len = iVar2;
  memcpy((void *)uVar3,paVar4,(long)iVar2 + 1);
  bVar1 = String::endsWith(&local_108,"/");
  if (bVar1) {
    String::append(&local_108,"index.html",10);
  }
  uVar3 = b;
  if (local_108._size != 0) {
    uVar3 = local_108.field_2._str;
  }
  String::concat(&local_90,&this->_webroot,(char *)uVar3,local_108._len);
  File::File((File *)local_78,&local_90);
  bVar1 = File::isDirectory((File *)local_78);
  if (bVar1) {
    HttpResponse::setCode(response,0x12d);
    String::String((String *)local_140,"Location");
    String::String(&local_a8,"Host");
    HttpMessage::header(&local_d8,&request->super_HttpMessage,&local_a8);
    String::String(&local_c0,"http://");
    uVar3 = local_d8.field_2._str;
    if (local_d8._size == 0) {
      uVar3 = &local_d8.field_2;
    }
    String::append(&local_c0,(char *)uVar3,local_d8._len);
    if (local_108._size != 0) {
      b = local_108.field_2._str;
    }
    String::concat((String *)local_f0,&local_c0,(char *)b,local_108._len);
    local_109 = '/';
    String::concat(&local_128,(String *)local_f0,&local_109,1);
    HttpMessage::setHeader(&response->super_HttpMessage,(String *)local_140,&local_128);
    if (local_128._size != 0) {
      free(local_128.field_2._str);
    }
    if (local_f0._0_4_ != 0) {
      free((void *)local_f0._8_8_);
    }
    if (local_c0._size != 0) {
      free(local_c0.field_2._str);
    }
    if (local_d8._size != 0) {
      free(local_d8.field_2._str);
    }
    if (local_a8._size != 0) {
      free(local_a8.field_2._str);
    }
    if (local_140._0_4_ != 0) {
      free((void *)local_140._8_8_);
    }
  }
  else {
    local_58 = -1;
    File::creationDate((File *)local_140);
    if (((double)CONCAT44(local_140._4_4_,local_140._0_4_) != 0.0) ||
       (NAN((double)CONCAT44(local_140._4_4_,local_140._0_4_)))) {
      String::String((String *)local_140,"If-Modified-Since");
      bVar1 = HttpMessage::hasHeader(&request->super_HttpMessage,(String *)local_140);
      if (local_140._0_4_ != 0) {
        free((void *)local_140._8_8_);
      }
      if (bVar1) {
        String::String(&local_128,"If-Modified-Since");
        HttpMessage::header((String *)local_140,&request->super_HttpMessage,&local_128);
        Date::Date((Date *)local_f0,(String *)local_140);
        if (local_140._0_4_ != 0) {
          free((void *)local_140._8_8_);
        }
        if (local_128._size != 0) {
          free(local_128.field_2._str);
        }
        File::lastModified((File *)local_140);
        if ((double)CONCAT44(local_140._4_4_,local_140._0_4_) <=
            (double)CONCAT44(local_f0._4_4_,local_f0._0_4_) + 1.0) {
          HttpResponse::setCode(response,0x130);
          goto LAB_001211f2;
        }
      }
      String::String((String *)local_140,"Last-Modified");
      File::lastModified((File *)local_f0);
      Date::toString(&local_128,(Date *)local_f0,HTTP,false);
      HttpMessage::setHeader(&response->super_HttpMessage,(String *)local_140,&local_128);
      if (local_128._size != 0) {
        free(local_128.field_2._str);
      }
      if (local_140._0_4_ != 0) {
        free((void *)local_140._8_8_);
      }
      HttpMessage::put(&response->super_HttpMessage,(File *)local_78);
    }
    else {
      HttpResponse::setCode(response,0x194);
      String::String((String *)local_140,"Content-Type");
      String::String(&local_128,"text/plain");
      HttpMessage::setHeader(&response->super_HttpMessage,(String *)local_140,&local_128);
      if (local_128._size != 0) {
        free(local_128.field_2._str);
      }
      if (local_140._0_4_ != 0) {
        free((void *)local_140._8_8_);
      }
      HttpMessage::put(&response->super_HttpMessage,"Not found");
    }
  }
LAB_001211f2:
  File::~File((File *)local_78);
  if (local_90._size != 0) {
    free(local_90.field_2._str);
  }
  if (local_108._size != 0) {
    free(local_108.field_2._str);
  }
  return;
}

Assistant:

void HttpServer::serveFile(HttpRequest& request, HttpResponse& response)
{
	if (request.method() == "GET")
	{
		String path = request.path();

		if (path.endsWith("/"))
			path += "index.html";

		String localpath = _webroot + path;
		File file(localpath);
		if (file.isDirectory())
		{
			response.setCode(301);
			response.setHeader("Location", "http://" + request.header("Host") + path + '/');
		}
		else if (file.exists())
		{
			if (request.hasHeader("If-Modified-Since"))
			{
				Date ifdate = request.header("If-Modified-Since");
				if (file.lastModified() <= ifdate + 1.0) {
					response.setCode(304);
					return;
				}
			}
			response.setHeader("Last-Modified", file.lastModified().toString(Date::HTTP));
			response.put(file);
		}
		else
		{
			response.setCode(404);
			response.setHeader("Content-Type", "text/plain");
			response.put("Not found");
		}
	}
	else
	{
		response.setCode(501);
		response.setHeader("Content-Type", "text/plain");
		response.put("Not implemented");
	}
}